

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O1

int CVmObjBigNum::radix_from_string(char *str,size_t len)

{
  uint ch;
  wchar_t wVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  bool bVar6;
  
  bVar6 = len == 0;
  if (!bVar6) {
    wVar1 = utf8_ptr::s_getch(str);
    pbVar5 = (byte *)str;
    while (((uint)wVar1 < 0x80 && (iVar2 = isspace(wVar1), iVar2 != 0))) {
      str = (char *)(pbVar5 + (ulong)(((*pbVar5 >> 5 & 1) != 0) + 1 & (uint)(*pbVar5 >> 7) * 3) + 1)
      ;
      len = (size_t)(pbVar5 + (len - (long)str));
      bVar6 = (byte *)len == (byte *)0x0;
      if (bVar6) goto LAB_0026ffa3;
      wVar1 = utf8_ptr::s_getch(str);
      pbVar5 = (byte *)str;
    }
    str = (char *)pbVar5;
    if ((!bVar6) &&
       ((wVar1 = utf8_ptr::s_getch((char *)pbVar5), wVar1 == L'-' ||
        (wVar1 = utf8_ptr::s_getch((char *)pbVar5), wVar1 == L'+')))) {
      len = (size_t)(pbVar5 + (len - (long)(pbVar5 + (ulong)(((*pbVar5 >> 5 & 1) != 0) + 1 &
                                                            (uint)(*pbVar5 >> 7) * 3) + 1)));
      str = (char *)(pbVar5 + (ulong)(((*pbVar5 >> 5 & 1) != 0) + 1 & (uint)(*pbVar5 >> 7) * 3) + 1)
      ;
    }
  }
LAB_0026ffa3:
  iVar2 = 10;
  bVar6 = (byte *)len == (byte *)0x0;
  if (!bVar6) {
    wVar1 = utf8_ptr::s_getch(str);
    while (((uint)wVar1 < 0x80 && (iVar3 = isspace(wVar1), iVar3 != 0))) {
      pbVar5 = (byte *)str +
               (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) + 1;
      len = (size_t)((byte *)str + (len - (long)pbVar5));
      bVar6 = (byte *)len == (byte *)0x0;
      if (bVar6) {
        return 10;
      }
      wVar1 = utf8_ptr::s_getch((char *)pbVar5);
      str = (char *)pbVar5;
    }
    if ((!bVar6) && (wVar1 = utf8_ptr::s_getch(str), wVar1 == L'0')) {
      pbVar5 = (byte *)str +
               (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) + 1;
      pbVar4 = (byte *)str + (len - (long)pbVar5);
      if (pbVar4 != (byte *)0x0) {
        wVar1 = utf8_ptr::s_getch((char *)pbVar5);
        if (wVar1 == L'x') {
          return 0x10;
        }
        wVar1 = utf8_ptr::s_getch((char *)pbVar5);
        if (wVar1 == L'X') {
          return 0x10;
        }
        do {
          wVar1 = utf8_ptr::s_getch((char *)pbVar5);
          if (7 < (uint)(wVar1 + L'\xffffffd0')) {
            if ((uint)(wVar1 + L'\xffffffd2') < 0x38) {
              if ((0x80000000800c01U >> ((ulong)(uint)(wVar1 + L'\xffffffd2') & 0x3f) & 1) == 0) {
                return 8;
              }
              return 10;
            }
            break;
          }
          pbVar4 = pbVar5 + ((long)pbVar4 -
                            (long)(pbVar5 + (ulong)(((*pbVar5 >> 5 & 1) != 0) + 1 &
                                                   (uint)(*pbVar5 >> 7) * 3) + 1));
          pbVar5 = pbVar5 + (ulong)(((*pbVar5 >> 5 & 1) != 0) + 1 & (uint)(*pbVar5 >> 7) * 3) + 1;
        } while (pbVar4 != (byte *)0x0);
      }
      iVar2 = 8;
    }
  }
  return iVar2;
}

Assistant:

int CVmObjBigNum::radix_from_string(const char *str, size_t len)
{
    /* set up to scan the string */
    utf8_ptr p((char *)str);
    size_t rem = len;

    /* skip leading spaces */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* skip the sign if present */
    if (rem != 0 && (p.getch() == '-' || p.getch() == '+'))
        p.inc(&rem);

    /* skip more spaces after the sign */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* check for a radix indicator */
    if (rem != 0 && p.getch() == '0')
    {
        /*
         *   There's a leading zero, so it could be hex or octal.  If there's
         *   an 'x', it's definitely hex.  Otherwise, it's octal as long as
         *   it's in purely integer format - that is, no decimal point or 'E'
         *   exponent marker.
         */
        p.inc(&rem);
        if (rem != 0 && (p.getch() == 'x' || p.getch() == 'X'))
        {
            /* 0x prefix, so it's definitely hex */
            return 16;
        }

        /* 
         *   There's a leading 0 but no 'x', so it could be octal or decimal,
         *   depending on what's in the rest of the string. 
         */
        for ( ; rem != 0 ; p.inc(&rem))
        {
            switch (p.getch())
            {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
                /* octal digit, so we can't rule anything out yet */
                continue;

            case '.':
            case 'e':
            case 'E':
                /* 
                 *   decimal point or exponent marker, so it's a floating
                 *   point value, which can only be decimal 
                 */
                return 10;
                
            case '8':
            case '9':
                /* an 8 or a 9 can only appear in a decimal number */
                return 10;

            default:
                /* 
                 *   Anything else is invalid within a number, whether octal
                 *   integer or floating point, so we've reached the end of
                 *   the number.  Since we didn't encounter anything that
                 *   makes the number a floating point value or decimal
                 *   integer, we have an octal integer.
                 */
                return 8;
            }
        }

        /* 
         *   we reached the end of the number without finding anything that
         *   would rule out treating it as an octal integer, so that's what
         *   it is 
         */
        return 8;
    }
    else
    {
        /* no leading '0', so it's decimal */
        return 10;
    }
}